

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvncclient.cpp
# Opt level: O3

void __thiscall QVncClient::setEncodings(QVncClient *this)

{
  uint uVar1;
  ssize_t sVar2;
  QLoggingCategory *pQVar3;
  undefined8 *puVar4;
  size_t in_RCX;
  void *in_RDX;
  int iVar5;
  long in_FS_OFFSET;
  qint32 enc_1;
  QRfbSetEncodings enc;
  char local_60 [24];
  char *local_48;
  uint local_40;
  QRfbSetEncodings local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3a.count = 0xaaaa;
  if (((*(int *)(this + 0x58) == 0) &&
      (sVar2 = QRfbSetEncodings::read(&local_3a,(int)*(undefined8 *)(this + 0x18),in_RDX,in_RCX),
      (char)sVar2 != '\0')) && (*(uint *)(this + 0x58) = (uint)local_3a.count, local_3a.count == 0))
  {
    this[0x2d] = (QVncClient)0x0;
  }
  if (*(long **)(this + 0x20) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x20) + 8))();
    *(undefined8 *)(this + 0x20) = 0;
  }
  if (*(int *)(this + 0x58) != 0) {
    uVar1 = (**(code **)(**(long **)(this + 0x18) + 0xa0))();
    if ((ulong)((long)*(int *)(this + 0x58) * 4) <= (ulong)uVar1) {
      if (0 < *(int *)(this + 0x58)) {
        iVar5 = 0;
        do {
          local_40 = 0xaaaaaaaa;
          QIODevice::read(*(char **)(this + 0x18),(longlong)&local_40);
          local_40 = local_40 >> 0x18 | (local_40 & 0xff0000) >> 8 | (local_40 & 0xff00) << 8 |
                     local_40 << 0x18;
          pQVar3 = lcVnc();
          if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
            local_48 = pQVar3->name;
            local_60[0] = '\x02';
            local_60[1] = '\0';
            local_60[2] = '\0';
            local_60[3] = '\0';
            local_60[4] = '\0';
            local_60[5] = '\0';
            local_60[6] = '\0';
            local_60[7] = '\0';
            local_60[8] = '\0';
            local_60[9] = '\0';
            local_60[10] = '\0';
            local_60[0xb] = '\0';
            local_60[0xc] = '\0';
            local_60[0xd] = '\0';
            local_60[0xe] = '\0';
            local_60[0xf] = '\0';
            local_60[0x10] = '\0';
            local_60[0x11] = '\0';
            local_60[0x12] = '\0';
            local_60[0x13] = '\0';
            local_60[0x14] = '\0';
            local_60[0x15] = '\0';
            local_60[0x16] = '\0';
            local_60[0x17] = '\0';
            QMessageLogger::debug(local_60,"QVncServer::setEncodings: %d",(ulong)local_40);
          }
          if ((int)local_40 < 0) {
            if (local_40 == 0xffffff11) {
              this[0x60] = (QVncClient)((byte)this[0x60] | 0x20);
              QVncScreen::enableClientCursor
                        (*(QVncScreen **)(*(long *)(this + 0x10) + 0x30),(QVncClient *)this);
            }
            else if (local_40 == 0xffffff21) {
              this[0x60] = (QVncClient)((byte)this[0x60] | 0x40);
            }
          }
          else {
            switch(local_40) {
            case 0:
              if (*(long *)(this + 0x20) == 0) {
                puVar4 = (undefined8 *)operator_new(0x28);
                puVar4[1] = this;
                *puVar4 = &PTR__QRfbRawEncoder_0011b940;
                puVar4[2] = 0;
                puVar4[3] = 0;
                puVar4[4] = 0;
                *(undefined8 **)(this + 0x20) = puVar4;
                pQVar3 = lcVnc();
                if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
                  local_48 = pQVar3->name;
                  local_60[0] = '\x02';
                  local_60[1] = '\0';
                  local_60[2] = '\0';
                  local_60[3] = '\0';
                  local_60[4] = '\0';
                  local_60[5] = '\0';
                  local_60[6] = '\0';
                  local_60[7] = '\0';
                  local_60[8] = '\0';
                  local_60[9] = '\0';
                  local_60[10] = '\0';
                  local_60[0xb] = '\0';
                  local_60[0xc] = '\0';
                  local_60[0xd] = '\0';
                  local_60[0xe] = '\0';
                  local_60[0xf] = '\0';
                  local_60[0x10] = '\0';
                  local_60[0x11] = '\0';
                  local_60[0x12] = '\0';
                  local_60[0x13] = '\0';
                  local_60[0x14] = '\0';
                  local_60[0x15] = '\0';
                  local_60[0x16] = '\0';
                  local_60[0x17] = '\0';
                  QMessageLogger::debug(local_60,"QVncServer::setEncodings: using raw");
                }
              }
              break;
            case 1:
              this[0x60] = (QVncClient)((byte)this[0x60] | 1);
              break;
            case 2:
              this[0x60] = (QVncClient)((byte)this[0x60] | 2);
              break;
            case 3:
              break;
            case 4:
              this[0x60] = (QVncClient)((byte)this[0x60] | 4);
              break;
            case 5:
              this[0x60] = (QVncClient)((byte)this[0x60] | 8);
              break;
            default:
              if (local_40 == 0x10) {
                this[0x60] = (QVncClient)((byte)this[0x60] | 0x10);
              }
            }
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < *(int *)(this + 0x58));
      }
      this[0x2d] = (QVncClient)0x0;
      *(undefined4 *)(this + 0x58) = 0;
    }
  }
  if (*(long *)(this + 0x20) == 0) {
    puVar4 = (undefined8 *)operator_new(0x28);
    puVar4[1] = this;
    *puVar4 = &PTR__QRfbRawEncoder_0011b940;
    puVar4[2] = 0;
    puVar4[3] = 0;
    puVar4[4] = 0;
    *(undefined8 **)(this + 0x20) = puVar4;
    pQVar3 = lcVnc();
    if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_48 = pQVar3->name;
      local_60[0] = '\x02';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      QMessageLogger::debug(local_60,"QVncServer::setEncodings: fallback using raw");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVncClient::setEncodings()
{
    QRfbSetEncodings enc;

    if (!m_encodingsPending && enc.read(m_clientSocket)) {
        m_encodingsPending = enc.count;
        if (!m_encodingsPending)
            m_handleMsg = false;
    }

    if (m_encoder) {
        delete m_encoder;
        m_encoder = nullptr;
    }

    enum Encodings {
        Raw = 0,
        CopyRect = 1,
        RRE = 2,
        CoRRE = 4,
        Hextile = 5,
        ZRLE = 16,
        Cursor = -239,
        DesktopSize = -223
    };

    if (m_encodingsPending && (unsigned)m_clientSocket->bytesAvailable() >=
                                m_encodingsPending * sizeof(quint32)) {
        for (int i = 0; i < m_encodingsPending; ++i) {
            qint32 enc;
            m_clientSocket->read((char *)&enc, sizeof(qint32));
            enc = ntohl(enc);
            qCDebug(lcVnc, "QVncServer::setEncodings: %d", enc);
            switch (enc) {
            case Raw:
                if (!m_encoder) {
                    m_encoder = new QRfbRawEncoder(this);
                    qCDebug(lcVnc, "QVncServer::setEncodings: using raw");
                }
               break;
            case CopyRect:
                m_supportCopyRect = true;
                break;
            case RRE:
                m_supportRRE = true;
                break;
            case CoRRE:
                m_supportCoRRE = true;
                break;
            case Hextile:
                m_supportHextile = true;
                if (m_encoder)
                    break;
                break;
            case ZRLE:
                m_supportZRLE = true;
                break;
            case Cursor:
                m_supportCursor = true;
                m_server->screen()->enableClientCursor(this);
                break;
            case DesktopSize:
                m_supportDesktopSize = true;
                break;
            default:
                break;
            }
        }
        m_handleMsg = false;
        m_encodingsPending = 0;
    }

    if (!m_encoder) {
        m_encoder = new QRfbRawEncoder(this);
        qCDebug(lcVnc, "QVncServer::setEncodings: fallback using raw");
    }
}